

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

int32_t __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy>::do_run_mode
          (jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy> *this,
          int32_t start_index,decoder_strategy *param_2)

{
  byte ra;
  sample_type sVar1;
  int32_t iVar2;
  int iVar3;
  uint uVar4;
  
  ra = this->current_line_[(long)start_index + -1];
  iVar2 = decode_run_pixels(this,ra,this->current_line_ + start_index,this->width_ - start_index);
  uVar4 = start_index + iVar2;
  if (uVar4 != this->width_) {
    sVar1 = decode_run_interruption_pixel(this,(uint)ra,(uint)this->previous_line_[uVar4]);
    this->current_line_[uVar4] = sVar1;
    iVar3 = 1;
    if (1 < this->run_index_) {
      iVar3 = this->run_index_;
    }
    this->run_index_ = iVar3 + -1;
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int32_t do_run_mode(const int32_t start_index, decoder_strategy* /*template_selector*/)
    {
        const pixel_type ra{current_line_[start_index - 1]};

        const int32_t run_length{decode_run_pixels(ra, current_line_ + start_index, width_ - start_index)};
        const uint32_t end_index{static_cast<uint32_t>(start_index + run_length)};

        if (end_index == width_)
            return end_index - start_index;

        // run interruption
        const pixel_type rb{previous_line_[end_index]};
        current_line_[end_index] = decode_run_interruption_pixel(ra, rb);
        decrement_run_index();
        return end_index - start_index + 1;
    }